

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs7_x509.cc
# Opt level: O0

PKCS7 * d2i_PKCS7_bio(BIO *bp,PKCS7 **p7)

{
  int iVar1;
  BIO *pBVar2;
  PKCS7 *ret;
  CBS cbs;
  size_t len;
  uint8_t *data;
  PKCS7 **out_local;
  BIO *bio_local;
  
  data = (uint8_t *)p7;
  out_local = (PKCS7 **)bp;
  iVar1 = BIO_read_asn1((BIO *)bp,(uint8_t **)&len,&cbs.len,0x400000);
  if (iVar1 == 0) {
    bio_local = (BIO *)0x0;
  }
  else {
    CBS_init((CBS *)&ret,(uint8_t *)len,cbs.len);
    pBVar2 = (BIO *)pkcs7_new((CBS *)&ret);
    OPENSSL_free((void *)len);
    bio_local = pBVar2;
    if ((data != (uint8_t *)0x0) && (pBVar2 != (BIO *)0x0)) {
      PKCS7_free(*(PKCS7 **)data);
      *(BIO **)data = pBVar2;
    }
  }
  return (PKCS7 *)bio_local;
}

Assistant:

PKCS7 *d2i_PKCS7_bio(BIO *bio, PKCS7 **out) {
  // Use a generous bound, to allow for PKCS#7 files containing large root sets.
  static const size_t kMaxSize = 4 * 1024 * 1024;
  uint8_t *data;
  size_t len;
  if (!BIO_read_asn1(bio, &data, &len, kMaxSize)) {
    return NULL;
  }

  CBS cbs;
  CBS_init(&cbs, data, len);
  PKCS7 *ret = pkcs7_new(&cbs);
  OPENSSL_free(data);
  if (out != NULL && ret != NULL) {
    PKCS7_free(*out);
    *out = ret;
  }
  return ret;
}